

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_Env_Test::TestBody(TApp_Env_Test *this)

{
  App *this_00;
  bool bVar1;
  Option *pOVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  int val;
  AssertHelper local_120;
  AssertHelper local_118;
  Message local_110;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  int local_fc;
  App *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0;
  char *local_90 [2];
  char local_80 [16];
  char *local_70 [2];
  char local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CLI11_TEST_ENV_TMP","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"2","");
  setenv(local_90[0],local_50[0],1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_fc = 1;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"--tmp","");
  pcVar3 = "";
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"","");
  local_f8 = &(this->super_TApp).app;
  pOVar2 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (local_f8,&local_b0,&local_fc,&local_d0);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CLI11_TEST_ENV_TMP","");
  std::__cxx11::string::_M_assign((string *)&pOVar2->envname_);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  TApp::run(&this->super_TApp);
  local_120.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_110,"2","val",(int *)&local_120,&local_fc);
  if (local_110.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = ((local_108.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x48b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_120.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_120.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_120.data_ = (AssertHelperData *)0x1;
  local_118.data_ =
       (AssertHelperData *)
       ((long)(pOVar2->results_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pOVar2->results_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_110,"(size_t)1","vopt->count()",(unsigned_long *)&local_120,
             (unsigned_long *)&local_118);
  if (local_110.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_108.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x48c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_120.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_120.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  this_00 = local_f8;
  CLI::App::reset(local_f8);
  (pOVar2->super_OptionBase<CLI::Option>).required_ = true;
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CLI11_TEST_ENV_TMP","");
  unsetenv(local_70[0]);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message(&local_110);
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x494,
             "Expected: run() throws an exception of type CLI::RequiredError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_120,&local_110);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  if (CONCAT71(local_110.ss_.ptr_._1_7_,local_110.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_110.ss_.ptr_._1_7_,local_110.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_110.ss_.ptr_._1_7_,local_110.ss_.ptr_._0_1_) + 8))();
    }
  }
  return;
}

Assistant:

TEST_F(TApp, Env) {

    put_env("CLI11_TEST_ENV_TMP", "2");

    int val = 1;
    CLI::Option *vopt = app.add_option("--tmp", val)->envname("CLI11_TEST_ENV_TMP");

    run();

    EXPECT_EQ(2, val);
    EXPECT_EQ((size_t)1, vopt->count());

    app.reset();
    vopt->required();
    run();

    app.reset();
    unset_env("CLI11_TEST_ENV_TMP");
    EXPECT_THROW(run(), CLI::RequiredError);
}